

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O1

void Fraig_FeedBackCheckTable(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  int iVar3;
  Fraig_NodeVec_t *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Fraig_Node_t *pFVar9;
  Fraig_Node_t *Entry;
  long lVar10;
  
  pFVar1 = p->pTableF;
  if (0 < pFVar1->nBins) {
    lVar5 = 0;
    do {
      for (pFVar9 = pFVar1->pBins[lVar5]; pFVar9 != (Fraig_Node_t *)0x0; pFVar9 = pFVar9->pNextF) {
        p->vCones->nSize = 0;
        Entry = pFVar9;
        do {
          Fraig_NodeVecPush(p->vCones,Entry);
          Entry = Entry->pNextD;
        } while (Entry != (Fraig_Node_t *)0x0);
        if ((p->vCones->nSize != 1) && (0 < p->vCones->nSize)) {
          lVar6 = 1;
          lVar7 = 0;
          do {
            lVar8 = lVar7 + 1;
            pFVar4 = p->vCones;
            lVar10 = lVar6;
            if (lVar8 < pFVar4->nSize) {
              do {
                iVar3 = Fraig_CompareSimInfo
                                  (pFVar4->pArray[lVar7],pFVar4->pArray[lVar10],p->iWordStart,0);
                if (iVar3 != 0) {
                  ppFVar2 = p->vCones->pArray;
                  printf("Nodes %d and %d have the same D simulation info.\n",
                         (ulong)(uint)ppFVar2[lVar7]->Num,(ulong)(uint)ppFVar2[lVar10]->Num);
                }
                lVar10 = lVar10 + 1;
                pFVar4 = p->vCones;
              } while ((int)lVar10 < pFVar4->nSize);
            }
            lVar6 = lVar6 + 1;
            lVar7 = lVar8;
          } while (lVar8 < p->vCones->nSize);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pFVar1->nBins);
  }
  return;
}

Assistant:

void Fraig_FeedBackCheckTable( Fraig_Man_t * p )
{
    Fraig_HashTable_t * pT = p->pTableF;
    Fraig_Node_t * pEntF, * pEntD;
    int i, k, m, nPairs;

    nPairs = 0;
    for ( i = 0; i < pT->nBins; i++ )
    Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryD( pEntF, pEntD )
            Fraig_NodeVecPush( p->vCones, pEntD );
        if ( p->vCones->nSize == 1 )
            continue;
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( Fraig_CompareSimInfo( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0 ) )
                    printf( "Nodes %d and %d have the same D simulation info.\n", 
                        p->vCones->pArray[k]->Num, p->vCones->pArray[m]->Num );
                nPairs++;
            }   
    }
//    printf( "\nThe total of %d node pairs have been verified.\n", nPairs );
}